

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenEnumOffsetAlias
          (KotlinKMPGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((enum_def->super_Definition).generated == false) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_40,&this->namer_,enum_def);
    std::operator+(&local_c0,"typealias ",&local_40);
    std::operator+(&local_a0,&local_c0,"Array = ");
    GenTypeBasic_abi_cxx11_(&local_e0,this,&(enum_def->underlying_type).base_type);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::operator+(&local_60,&local_80,"Array");
    CodeWriter::operator+=(writer,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void GenEnumOffsetAlias(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;
    // This assumes offset as Ints always.
    writer += "typealias " + namer_.Type(enum_def) +
              "Array = " + GenTypeBasic(enum_def.underlying_type.base_type) +
              "Array";
  }